

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
EefcFlash::getLockRegions
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,EefcFlash *this)

{
  uint uVar1;
  reference rVar2;
  reference local_58;
  reference local_48;
  uint local_38;
  uint local_34;
  uint32_t region;
  uint32_t bit;
  uint32_t frr;
  allocator<bool> local_1a;
  undefined1 local_19;
  EefcFlash *local_18;
  EefcFlash *this_local;
  vector<bool,_std::allocator<bool>_> *regions;
  
  local_19 = 0;
  uVar1 = (this->super_Flash)._lockRegions;
  local_18 = this;
  this_local = (EefcFlash *)__return_storage_ptr__;
  std::allocator<bool>::allocator(&local_1a);
  std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__,(ulong)uVar1,&local_1a);
  std::allocator<bool>::~allocator(&local_1a);
  waitFSR(this,1);
  for (local_38 = 0; local_38 < (this->super_Flash)._lockRegions; local_38 = local_38 + 1) {
    if (((this->super_Flash)._planes == 2) && ((this->super_Flash)._lockRegions >> 1 <= local_38)) {
      local_34 = local_38 - ((this->super_Flash)._lockRegions >> 1);
      writeFCR1(this,'\n',0);
      waitFSR(this,1);
      region = readFRR1(this);
      for (; 0x1f < local_34; local_34 = local_34 - 0x20) {
        region = readFRR1(this);
      }
      uVar1 = region >> (local_34 & 0x1f);
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (__return_storage_ptr__,(ulong)local_38);
      local_48 = rVar2;
      std::_Bit_reference::operator=(&local_48,(uVar1 & 1) != 0);
    }
    else {
      local_34 = local_38;
      writeFCR0(this,'\n',0);
      waitFSR(this,1);
      region = readFRR0(this);
      for (; 0x1f < local_34; local_34 = local_34 - 0x20) {
        region = readFRR0(this);
      }
      uVar1 = region >> (local_34 & 0x1f);
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (__return_storage_ptr__,(ulong)local_38);
      local_58 = rVar2;
      std::_Bit_reference::operator=(&local_58,(uVar1 & 1) != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool>
EefcFlash::getLockRegions()
{
    std::vector<bool> regions(_lockRegions);
    uint32_t frr;
    uint32_t bit;

    waitFSR();
    for (uint32_t region = 0; region < _lockRegions; region++)
    {
        if (_planes == 2 && region >= _lockRegions / 2)
        {
            bit = region - _lockRegions / 2;
            writeFCR1(EEFC_FCMD_GLB, 0);
            waitFSR();
            frr = readFRR1();
            while (bit >= 32)
            {
                frr = readFRR1();
                bit -= 32;
            }
            regions[region] = (frr & (1 << bit)) != 0;
        }
        else
        {
            bit = region;
            writeFCR0(EEFC_FCMD_GLB, 0);
            waitFSR();
            frr = readFRR0();
            while (bit >= 32)
            {
                frr = readFRR0();
                bit -= 32;
            }
            regions[region] = (frr & (1 << bit)) != 0;
        }
    }

    return regions;
}